

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O2

void __thiscall ON_Decal::CImpl::SetMapToInside(CImpl *this,bool b)

{
  int iVar1;
  undefined7 in_register_00000031;
  ON_XMLVariant OStack_108;
  
  iVar1 = (int)CONCAT71(in_register_00000031,b);
  if ((this->_cache).map_to_inside != iVar1) {
    (this->_cache).map_to_inside = iVar1;
    ::ON_XMLVariant::ON_XMLVariant(&OStack_108,b);
    SetParameter(this,L"map-to-inside-on",&OStack_108);
    ::ON_XMLVariant::~ON_XMLVariant(&OStack_108);
  }
  return;
}

Assistant:

void ON_Decal::CImpl::SetMapToInside(bool b)
{
  const int i = b ? 1 : 0;
  if (_cache.map_to_inside != i)
  {
    _cache.map_to_inside = i;
    SetParameter(ON_RDK_DECAL_MAP_TO_INSIDE_ON, b);
  }
}